

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void jsondec_consumews(jsondec *d)

{
  jsondec *d_local;
  
  while (d->ptr != d->end) {
    switch(*d->ptr) {
    case '\t':
    case '\r':
    case ' ':
      goto switchD_00553463_caseD_9;
    case '\n':
      d->line = d->line + 1;
      d->line_begin = d->ptr;
switchD_00553463_caseD_9:
      d->ptr = d->ptr + 1;
      break;
    default:
      return;
    }
  }
  return;
}

Assistant:

static void jsondec_consumews(jsondec* d) {
  while (d->ptr != d->end) {
    switch (*d->ptr) {
      case '\n':
        d->line++;
        d->line_begin = d->ptr;
        /* Fallthrough. */
      case '\r':
      case '\t':
      case ' ':
        d->ptr++;
        break;
      default:
        return;
    }
  }
}